

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O3

void __thiscall Sandbox::error(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  long lVar1;
  u32 *puVar2;
  ulong uVar3;
  
  lVar1 = this->errors;
  this->errors = lVar1 + 1;
  if (lVar1 == 0) {
    printf("\nACCESS %d DOESN\'T MATCH:\n",(ulong)(uint)this->replayCnt);
    printf("i: %2d  ",(ulong)(uint)this->replayCnt);
    printf("Type: %s  ",accessTypeStr[type]);
    printf("Addr: %4x  ",(ulong)addr);
    printf("Cycle: %3lu  ",cycle);
    printf("FC: %d  ",(ulong)fc);
    if ((type & ~PEEK16) == POKE8) {
      printf("Value: %4x  ",(ulong)value);
    }
    puts("\n");
    puts("ACCESS RECORD:");
    if (0 < this->recordCnt) {
      puVar2 = &this->access[0].fc;
      uVar3 = 0;
      do {
        printf("i: %2d  ",uVar3 & 0xffffffff);
        printf("Type: %s  ",accessTypeStr[((AccessRecord *)(puVar2 + -6))->type]);
        printf("Addr: %4x  ",(ulong)puVar2[-5]);
        printf("Cycle: %3lu  ",*(u64 *)(puVar2 + -2));
        printf("FC: %d  ",(ulong)*puVar2);
        printf("Value: %4x  ",(ulong)*(ushort *)(puVar2 + -4));
        putchar(10);
        uVar3 = uVar3 + 1;
        puVar2 = puVar2 + 8;
      } while ((long)uVar3 < (long)this->recordCnt);
    }
  }
  return;
}

Assistant:

void
Sandbox::error(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (errors++ == 0) {

        printf("\nACCESS %d DOESN'T MATCH:\n", replayCnt);
        printf("i: %2d  ", replayCnt);
        printf("Type: %s  ", accessTypeStr[type]);
        printf("Addr: %4x  ", addr);
        printf("Cycle: %3lu  ", (long)cycle);
        printf("FC: %d  ", fc);
        if (type == POKE8 || type == POKE16) printf("Value: %4x  ", value);
        printf("\n\n");

        printf("ACCESS RECORD:\n");
        for (int i = 0; i < recordCnt; i++) {
            printf("i: %2d  ", i);
            printf("Type: %s  ", accessTypeStr[access[i].type]);
            printf("Addr: %4x  ", access[i].addr);
            printf("Cycle: %3lu  ", (long)access[i].cycle);
            printf("FC: %d  ", access[i].fc);
            printf("Value: %4x  ", access[i].value);
            printf("\n");
        }
    }
}